

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cpp
# Opt level: O0

Search * __thiscall Search::construct_path_abi_cxx11_(Search *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  element_type *peVar6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  long in_RSI;
  char cVar7;
  int delta_y;
  int delta_x;
  shared_ptr<Node> parent;
  shared_ptr<Node> p;
  Search *this_local;
  string *path;
  
  std::__cxx11::string::string((string *)this);
  std::shared_ptr<Node>::shared_ptr
            ((shared_ptr<Node> *)
             &parent.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr<Node> *)(in_RSI + 0x18));
  while( true ) {
    peVar6 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &parent.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    bVar4 = std::operator!=(&peVar6->parent,(nullptr_t)0x0);
    if (!bVar4) break;
    peVar6 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &parent.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::shared_ptr<Node>::shared_ptr((shared_ptr<Node> *)&delta_y,&peVar6->parent);
    peVar6 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &parent.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    iVar1 = peVar6->x;
    peVar6 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &delta_y);
    iVar2 = peVar6->x;
    peVar6 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &parent.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    iVar3 = peVar6->y;
    peVar6 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &delta_y);
    iVar5 = iVar3 - peVar6->y;
    cVar7 = (char)this;
    if ((iVar1 == iVar2) && (iVar5 == 1)) {
      std::__cxx11::string::push_back(cVar7);
    }
    else if ((iVar1 == iVar2) && (iVar5 == -1)) {
      std::__cxx11::string::push_back(cVar7);
    }
    else if ((iVar1 - iVar2 == 1) && (iVar3 == peVar6->y)) {
      std::__cxx11::string::push_back(cVar7);
    }
    else {
      std::__cxx11::string::push_back(cVar7);
    }
    std::shared_ptr<Node>::~shared_ptr((shared_ptr<Node> *)&delta_y);
    peVar6 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &parent.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::shared_ptr<Node>::operator=
              ((shared_ptr<Node> *)
               &parent.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &peVar6->parent);
  }
  std::shared_ptr<Node>::~shared_ptr
            ((shared_ptr<Node> *)
             &parent.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  __first._M_current = (char *)std::__cxx11::string::begin();
  __last._M_current = (char *)std::__cxx11::string::end();
  std::reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(__first,__last);
  return this;
}

Assistant:

string Search::construct_path() {
    string path;
    for (auto p = final; p->parent != nullptr; p = p->parent) {
        auto parent = p->parent;
        int delta_x = p->x - parent->x;
        int delta_y = p->y - parent->y;
        if (delta_x == 0 and delta_y == 1) path.push_back('R');
        else if (delta_x == 0 and delta_y == -1) path.push_back('L');
        else if (delta_x == 1 and delta_y == 0) path.push_back('D');
        else path.push_back('U');
    }
    reverse(path.begin(), path.end());
    return path;
}